

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestValueTestcompareType::runTestCase(TestValueTestcompareType *this)

{
  TestResult *pTVar1;
  Value local_a0;
  Value local_78;
  PredicateContext local_50;
  
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x572;
  local_50.expr_ = "checkIsLess(Json::Value(), Json::Value(1))";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,nullValue);
  Json::Value::Value(&local_a0,1);
  ValueTest::checkIsLess(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x573;
  local_50.expr_ = "checkIsLess(Json::Value(1), Json::Value(1u))";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,1);
  Json::Value::Value(&local_a0,1);
  ValueTest::checkIsLess(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x574;
  local_50.expr_ = "checkIsLess(Json::Value(1u), Json::Value(1.0))";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,1);
  Json::Value::Value(&local_a0,1.0);
  ValueTest::checkIsLess(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x575;
  local_50.expr_ = "checkIsLess(Json::Value(1.0), Json::Value(\"a\"))";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,1.0);
  Json::Value::Value(&local_a0,"a");
  ValueTest::checkIsLess(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x576;
  local_50.expr_ = "checkIsLess(Json::Value(\"a\"), Json::Value(true))";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,"a");
  Json::Value::Value(&local_a0,true);
  ValueTest::checkIsLess(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x578;
  local_50.expr_ = "checkIsLess(Json::Value(true), Json::Value(Json::arrayValue))";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,true);
  Json::Value::Value(&local_a0,arrayValue);
  ValueTest::checkIsLess(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_50.id_ = pTVar1->predicateId_;
  local_50.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_50.line_ = 0x57a;
  local_50.expr_ = "checkIsLess(Json::Value(Json::arrayValue), Json::Value(Json::objectValue))";
  local_50.next_ = (PredicateContext *)0x0;
  local_50.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_50;
  pTVar1->predicateId_ = local_50.id_ + 1;
  pTVar1->predicateStackTail_ = &local_50;
  Json::Value::Value(&local_78,arrayValue);
  Json::Value::Value(&local_a0,objectValue);
  ValueTest::checkIsLess(&this->super_ValueTest,&local_78,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::~Value(&local_78);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareType) {
  // object of different type are ordered according to their type
  JSONTEST_ASSERT_PRED(checkIsLess(Json::Value(), Json::Value(1)));
  JSONTEST_ASSERT_PRED(checkIsLess(Json::Value(1), Json::Value(1u)));
  JSONTEST_ASSERT_PRED(checkIsLess(Json::Value(1u), Json::Value(1.0)));
  JSONTEST_ASSERT_PRED(checkIsLess(Json::Value(1.0), Json::Value("a")));
  JSONTEST_ASSERT_PRED(checkIsLess(Json::Value("a"), Json::Value(true)));
  JSONTEST_ASSERT_PRED(
      checkIsLess(Json::Value(true), Json::Value(Json::arrayValue)));
  JSONTEST_ASSERT_PRED(checkIsLess(Json::Value(Json::arrayValue),
                                   Json::Value(Json::objectValue)));
}